

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorInfo
               (SnapObject *snpObject,RecyclableObject *obj,InflateMap *inflator)

{
  bool doProfile;
  ScriptContext *pSVar1;
  SnapGeneratorInfo *pSVar2;
  ScriptFunction *ptr;
  FunctionBody *this;
  ByteCodeReader *this_00;
  Recycler *this_01;
  WriteBarrierPtr<void> *frameSlotArray;
  Var ptr_00;
  uint slotCount;
  ulong uVar3;
  WriteBarrierPtr<void> *this_02;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  pSVar1 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pSVar2 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapGeneratorInfo*,(TTD::NSSnapObjects::SnapObjectType)37>
                     (snpObject);
  if ((pSVar2->scriptFunction == 0) ||
     (ptr = (ScriptFunction *)InflateMap::LookupObject(inflator,pSVar2->scriptFunction),
     ptr == (ScriptFunction *)0x0)) {
    if (*(int *)&obj[2].type.ptr != 3) {
      TTDAbort_unrecoverable_error
                ("Unexpected null scriptFunction when generator is not in completed state");
    }
  }
  else {
    Memory::WriteBarrierPtr<Js::ScriptFunction>::WriteBarrierSet
              ((WriteBarrierPtr<Js::ScriptFunction> *)(obj + 4),ptr);
    this = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)ptr);
    Js::FunctionBody::EnsureDynamicProfileInfo(this);
    doProfile = Js::InterpreterStackFrame::ShouldDoProfile(this);
    this_00 = (ByteCodeReader *)
              Js::InterpreterStackFrame::CreateInterpreterStackFrameForGenerator
                        (ptr,this,(JavascriptGenerator *)obj,doProfile);
    if ((ByteCodeReader *)
        obj[2].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject !=
        this_00) {
      TTDAbort_unrecoverable_error("unexpected frame mis-match");
    }
    if ((ulong)pSVar2->frame_slotCount == 0) {
      slotCount = 0;
      frameSlotArray = (Type *)0x0;
    }
    else {
      local_68 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_416bdc7;
      data.filename._0_4_ = 0x909;
      data.plusSize = (ulong)pSVar2->frame_slotCount;
      data._32_8_ = this_00;
      this_01 = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)local_68);
      frameSlotArray =
           Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                     ((Memory *)this_01,(Recycler *)Memory::Recycler::Alloc,0,
                      (ulong)pSVar2->frame_slotCount);
      this_02 = frameSlotArray;
      for (uVar3 = 0; slotCount = pSVar2->frame_slotCount, this_00 = (ByteCodeReader *)data._32_8_,
          uVar3 < slotCount; uVar3 = uVar3 + 1) {
        if (pSVar2->frame_slotArray[uVar3] == (TTDVar)0x0) {
          this_02->ptr = (void *)0x0;
        }
        else {
          ptr_00 = InflateMap::InflateTTDVar(inflator,pSVar2->frame_slotArray[uVar3]);
          Memory::WriteBarrierPtr<void>::WriteBarrierSet(this_02,ptr_00);
        }
        this_02 = this_02 + 1;
      }
    }
    if (pSVar2->byteCodeReader_offset != 0) {
      Js::JavascriptGenerator::SetFrameSlots((JavascriptGenerator *)obj,slotCount,frameSlotArray);
      Js::InterpreterStackFrame::InitializeClosures((InterpreterStackFrame *)this_00);
      Js::ByteCodeReader::SetCurrentOffset(this_00,pSVar2->byteCodeReader_offset);
    }
  }
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapGeneratorInfo(const SnapObject* snpObject, Js::RecyclableObject* obj, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            Js::JavascriptGenerator* generator = reinterpret_cast<Js::JavascriptGenerator*>(obj);

            SnapGeneratorInfo* generatorInfo = SnapObjectGetAddtlInfoAs<SnapGeneratorInfo*, SnapObjectType::SnapGenerator>(snpObject);
            Js::ScriptFunction* scriptFunction = reinterpret_cast<Js::ScriptFunction*>((generatorInfo->scriptFunction != TTD_INVALID_PTR_ID) ? inflator->LookupObject(generatorInfo->scriptFunction) : nullptr);
            if (scriptFunction != nullptr)
            {
                generator->SetScriptFunction(scriptFunction);
                Js::FunctionBody* executeFunction = scriptFunction->GetFunctionBody();

#if ENABLE_PROFILE_INFO
                // call EnsureDynamicProfileInfo or we get asserts in some cases when creating the InterpreterStackFrame
                executeFunction->EnsureDynamicProfileInfo();
#endif
                bool doProfile = Js::InterpreterStackFrame::ShouldDoProfile(executeFunction);

                Js::InterpreterStackFrame* frame = Js::InterpreterStackFrame::CreateInterpreterStackFrameForGenerator(scriptFunction, executeFunction, generator, doProfile);
                TTDAssert(generator->GetFrame() == frame, "unexpected frame mis-match");

                Field(Js::Var)* frameSlotArray = nullptr;
                if (generatorInfo->frame_slotCount != 0)
                {
                    frameSlotArray = RecyclerNewArray(ctx->GetRecycler(), Field(Js::Var), generatorInfo->frame_slotCount);

                    for (Js::RegSlot i = 0; i < generatorInfo->frame_slotCount; i++)
                    {
                        if (generatorInfo->frame_slotArray[i] != nullptr)
                        {
                            frameSlotArray[i] = inflator->InflateTTDVar(generatorInfo->frame_slotArray[i]);
                        }
                        else
                        {
                            frameSlotArray[i] = nullptr;
                        }
                    }
                }

                if (generatorInfo->byteCodeReader_offset > 0)
                {
                    generator->SetFrameSlots(generatorInfo->frame_slotCount, frameSlotArray);
                    frame->InitializeClosures();
                    frame->GetReader()->SetCurrentOffset(generatorInfo->byteCodeReader_offset);
                }
            }
            else
            {
                TTDAssert(generator->IsCompleted(), "Unexpected null scriptFunction when generator is not in completed state");
            }
        }